

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  string_t new_value;
  uint uVar1;
  TemplatedValidityMask<unsigned_long> *this;
  idx_t iVar2;
  string_t *psVar3;
  ulong in_RCX;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  hugeint_t new_value_00;
  ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state_1;
  idx_t sidx_1;
  idx_t i_1;
  string_t *sort_key_data;
  Vector sliced_input;
  SelectionVector sel;
  OrderModifiers modifiers;
  Vector sort_key;
  ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state;
  idx_t sidx;
  bool arg_null;
  idx_t aidx;
  hugeint_t bval;
  idx_t bidx;
  idx_t i;
  ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> **states;
  idx_t assign_count;
  sel_t assign_sel [2048];
  ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *last_state;
  UnifiedVectorFormat sdata;
  hugeint_t *bys;
  bool extra_state;
  UnifiedVectorFormat bdata;
  Vector *by;
  UnifiedVectorFormat adata;
  Vector *arg;
  hugeint_t *in_stack_ffffffffffffdcf8;
  SelectionVector *this_00;
  undefined5 in_stack_ffffffffffffdd00;
  undefined1 in_stack_ffffffffffffdd05;
  undefined1 in_stack_ffffffffffffdd06;
  undefined1 in_stack_ffffffffffffdd07;
  idx_t in_stack_ffffffffffffdd08;
  UnifiedVectorFormat *this_01;
  sel_t *in_stack_ffffffffffffdd18;
  SelectionVector *in_stack_ffffffffffffdd20;
  undefined8 in_stack_ffffffffffffdd28;
  idx_t local_22c0;
  Vector local_22a8 [104];
  SelectionVector local_2240;
  OrderModifiers local_2222;
  LogicalType local_2220 [24];
  Vector local_2208 [108];
  undefined4 local_219c;
  hugeint_t *local_2198;
  uint64_t local_2190;
  ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *local_2188;
  idx_t local_2180;
  byte local_2171;
  idx_t local_2170;
  hugeint_t *local_2168;
  uint64_t uStack_2160;
  idx_t local_2158;
  UnifiedVectorFormat *local_2150;
  TemplatedValidityMask<unsigned_long> *local_2148;
  ulong local_2140;
  uint local_2138 [2048];
  ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *local_138;
  SelectionVector *local_130 [9];
  hugeint_t *local_e8;
  undefined1 local_d9;
  SelectionVector *local_d8 [9];
  Vector *local_90;
  SelectionVector *local_78 [9];
  Vector *local_30;
  UnifiedVectorFormat *local_28;
  ulong local_20;
  Vector *local_8;
  
  this_01 = (UnifiedVectorFormat *)local_78;
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this_01);
  duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_28);
  local_90 = local_8 + 0x68;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_d8);
  local_d9 = SpecializedGenericArgMinMaxState::CreateExtraState((idx_t)local_28);
  SpecializedGenericArgMinMaxState::PrepareData
            ((Vector *)this_01,in_stack_ffffffffffffdd08,
             (bool *)CONCAT17(in_stack_ffffffffffffdd07,
                              CONCAT16(in_stack_ffffffffffffdd06,
                                       CONCAT15(in_stack_ffffffffffffdd05,in_stack_ffffffffffffdd00)
                                      )),(UnifiedVectorFormat *)in_stack_ffffffffffffdcf8);
  local_e8 = UnifiedVectorFormat::GetData<duckdb::hugeint_t>((UnifiedVectorFormat *)local_d8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_130);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_138 = (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *)0x0;
  local_2140 = 0;
  this = (TemplatedValidityMask<unsigned_long> *)
         UnifiedVectorFormat::GetData<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>*>
                   ((UnifiedVectorFormat *)local_130);
  local_2148 = this;
  for (local_2150 = (UnifiedVectorFormat *)0x0; local_2150 < local_28; local_2150 = local_2150 + 1)
  {
    local_2158 = SelectionVector::get_index(local_d8[0],(idx_t)local_2150);
    in_stack_ffffffffffffdd07 =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   (this,CONCAT17(in_stack_ffffffffffffdd07,
                                  CONCAT16(in_stack_ffffffffffffdd06,
                                           CONCAT15(in_stack_ffffffffffffdd05,
                                                    in_stack_ffffffffffffdd00))));
    if ((bool)in_stack_ffffffffffffdd07) {
      local_2168 = (hugeint_t *)local_e8[local_2158].lower;
      uStack_2160 = local_e8[local_2158].upper;
      local_2170 = SelectionVector::get_index(local_78[0],(idx_t)local_2150);
      in_stack_ffffffffffffdd06 =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     (this,CONCAT17(in_stack_ffffffffffffdd07,
                                    CONCAT16(in_stack_ffffffffffffdd06,
                                             CONCAT15(in_stack_ffffffffffffdd05,
                                                      in_stack_ffffffffffffdd00))));
      local_2171 = (in_stack_ffffffffffffdd06 ^ 0xff) & 1;
      if (local_2171 == 0) {
        iVar2 = SelectionVector::get_index(local_130[0],(idx_t)local_2150);
        local_2188 = (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *)
                     (&local_2148->validity_mask)[iVar2];
        local_2180 = iVar2;
        if ((((local_2188->super_ArgMinMaxStateBase).is_initialized & 1U) == 0) ||
           (in_stack_ffffffffffffdd05 =
                 LessThan::Operation<duckdb::hugeint_t>
                           ((hugeint_t *)
                            CONCAT17(in_stack_ffffffffffffdd07,
                                     CONCAT16(in_stack_ffffffffffffdd06,
                                              CONCAT15(in_stack_ffffffffffffdd05,
                                                       in_stack_ffffffffffffdd00))),
                            in_stack_ffffffffffffdcf8), (bool)in_stack_ffffffffffffdd05)) {
          local_2198 = local_2168;
          local_2190 = uStack_2160;
          new_value_00.upper = iVar2;
          new_value_00.lower = uStack_2160;
          ArgMinMaxStateBase::AssignValue<duckdb::hugeint_t>
                    ((ArgMinMaxStateBase *)&local_2188->value,local_2168,new_value_00);
          (local_2188->super_ArgMinMaxStateBase).arg_null = (bool)(local_2171 & 1);
          if ((local_2171 & 1) == 0) {
            if (local_2188 == local_138) {
              local_2140 = local_2140 - 1;
            }
            uVar1 = UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)local_2150);
            local_2138[local_2140] = uVar1;
            local_138 = local_2188;
            local_2140 = local_2140 + 1;
          }
          (local_2188->super_ArgMinMaxStateBase).is_initialized = true;
        }
      }
    }
  }
  if (local_2140 == 0) {
    local_219c = 1;
  }
  else {
    duckdb::LogicalType::LogicalType(local_2220,BLOB);
    duckdb::Vector::Vector(local_2208,local_2220,0x800);
    duckdb::LogicalType::~LogicalType(local_2220);
    OrderModifiers::OrderModifiers(&local_2222,ASCENDING,NULLS_LAST);
    SelectionVector::SelectionVector(in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
    duckdb::Vector::Vector(local_22a8,local_30,&local_2240,local_2140);
    duckdb::CreateSortKeyHelpers::CreateSortKey(local_22a8,local_2140,local_2222,local_2208);
    psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0x89a583);
    for (local_22c0 = 0; local_22c0 < local_2140; local_22c0 = local_22c0 + 1) {
      this_00 = local_130[0];
      iVar2 = SelectionVector::get_index(&local_2240,local_22c0);
      iVar2 = SelectionVector::get_index(this_00,iVar2);
      new_value.value.pointer.ptr = (char *)(&local_2148->validity_mask)[iVar2];
      new_value.value._0_8_ = in_stack_ffffffffffffdd28;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((string_t *)psVar3[local_22c0].value.pointer.ptr,new_value);
    }
    Vector::~Vector((Vector *)
                    CONCAT17(in_stack_ffffffffffffdd07,
                             CONCAT16(in_stack_ffffffffffffdd06,
                                      CONCAT15(in_stack_ffffffffffffdd05,in_stack_ffffffffffffdd00))
                            ));
    SelectionVector::~SelectionVector((SelectionVector *)0x89a6bb);
    Vector::~Vector((Vector *)
                    CONCAT17(in_stack_ffffffffffffdd07,
                             CONCAT16(in_stack_ffffffffffffdd06,
                                      CONCAT15(in_stack_ffffffffffffdd05,in_stack_ffffffffffffdd00))
                            ));
    local_219c = 0;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)
             CONCAT17(in_stack_ffffffffffffdd07,
                      CONCAT16(in_stack_ffffffffffffdd06,
                               CONCAT15(in_stack_ffffffffffffdd05,in_stack_ffffffffffffdd00))));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)
             CONCAT17(in_stack_ffffffffffffdd07,
                      CONCAT16(in_stack_ffffffffffffdd06,
                               CONCAT15(in_stack_ffffffffffffdd05,in_stack_ffffffffffffdd00))));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)
             CONCAT17(in_stack_ffffffffffffdd07,
                      CONCAT16(in_stack_ffffffffffffdd06,
                               CONCAT15(in_stack_ffffffffffffdd05,in_stack_ffffffffffffdd00))));
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}